

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_input_event_loop.cpp
# Opt level: O1

bool __thiscall cppurses::detail::User_input_event_loop::loop_function(User_input_event_loop *this)

{
  Event *pEVar1;
  pointer *__ptr;
  unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> event;
  _Head_base<0UL,_cppurses::Event_*,_false> local_18;
  Event *local_10;
  
  input::get();
  pEVar1 = local_10;
  if (local_10 != (Event *)0x0) {
    local_18._M_head_impl = local_10;
    local_10 = (Event *)0x0;
    System::post_event((unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> *)
                       &local_18);
    if (local_18._M_head_impl != (Event *)0x0) {
      (*(local_18._M_head_impl)->_vptr_Event[1])();
    }
    local_18._M_head_impl = (Event *)0x0;
  }
  if (local_10 != (Event *)0x0) {
    (*local_10->_vptr_Event[1])();
  }
  return pEVar1 != (Event *)0x0;
}

Assistant:

auto User_input_event_loop::loop_function() -> bool
{
    auto event = input::get();
    if (event == nullptr)
        return false;
    System::post_event(std::move(event));
    return true;
}